

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::getQuadratureWeights<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,double *weights)

{
  int iVar1;
  int iVar2;
  GridLocalPolynomial *pGVar3;
  GridLocalPolynomial *pGVar4;
  int *piVar5;
  int iVar6;
  Data2D<int> *pDVar7;
  pointer piVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  ulong uVar12;
  int iVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  MultiIndexSet *mset;
  double dVar18;
  Data2D<int> lparents;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  uint local_15c;
  allocator_type local_152;
  bool local_151;
  GridLocalPolynomial *local_150;
  ulong local_148;
  ulong local_140;
  MultiIndexSet *local_138;
  Data2D<int> local_130;
  long local_108;
  ulong local_100;
  Data2D<int> local_f8;
  vector<double,_std::allocator<double>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  double *local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  vector<int,_std::allocator<int>_> *local_60;
  Data2D<int> *local_58;
  double local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  mset = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    mset = &(this->super_BaseCanonicalGrid).needed;
  }
  local_80 = weights;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x23])();
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_98,(long)this->top_level + 1,(allocator_type *)&local_f8);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,(long)this->top_level + 1,(allocator_type *)&local_f8);
  local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.stride = 0;
  local_f8.num_strips = 0;
  local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar16 = (uint)(this->parents).num_strips;
  local_15c = uVar16;
  if (mset->cache_num_indexes != uVar16) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>(&local_130,mset);
    local_f8.stride = local_130.stride;
    local_f8.num_strips = local_130.num_strips;
    ::std::vector<int,_std::allocator<int>_>::operator=(&local_f8.vec,&local_130.vec);
    if ((ulong *)local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar16 = (uint)(this->parents).num_strips;
    local_15c = mset->cache_num_indexes;
  }
  local_138 = mset;
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)4>(&local_48,mset);
  iVar13 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,(long)iVar13,(allocator_type *)&local_130);
  local_151 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_130,(long)local_138->cache_num_indexes,
             &local_151,&local_152);
  local_140 = (ulong)(uint)this->top_level;
  local_150 = this;
  if (0 < this->top_level) {
    local_100 = (ulong)(uint)(iVar13 * 2);
    local_78 = (ulong)local_15c;
    local_58 = &this->parents;
    local_60 = &(this->parents).vec;
    do {
      if (0 < (int)local_15c) {
        local_108 = 0;
        uVar9 = 0;
        do {
          pGVar3 = local_150;
          local_148 = uVar9;
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar9] == (int)local_140) {
            if (0 < (local_150->super_BaseCanonicalGrid).num_dimensions) {
              lVar10 = local_138->num_dimensions * local_108;
              piVar8 = (local_138->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar17 = 0;
              do {
                dVar18 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)4>
                                   (*(int *)((long)piVar8 + lVar17 * 4 + lVar10));
                local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17] = dVar18;
                lVar17 = lVar17 + 1;
              } while (lVar17 < (pGVar3->super_BaseCanonicalGrid).num_dimensions);
            }
            iVar13 = (int)local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            piVar8 = local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar11 = (ulong *)local_130.stride;
            if ((pointer)local_130.stride !=
                local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              memset((void *)local_130.stride,0,
                     (long)local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start - local_130.stride);
              puVar11 = (ulong *)piVar8;
            }
            if (iVar13 != 0) {
              *puVar11 = *puVar11 & ~(0xffffffffffffffffU >> (-(char)iVar13 & 0x3fU));
            }
            *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            *local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = (int)local_148;
            if (*local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)local_100) {
              iVar13 = 0;
              piVar5 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar8 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = local_100;
              do {
                pGVar3 = local_150;
                iVar1 = piVar5[iVar13];
                if (iVar1 < (int)uVar9) {
                  pDVar7 = &local_f8;
                  if (local_15c == uVar16) {
                    pDVar7 = local_58;
                  }
                  pvVar14 = &local_f8.vec;
                  if (local_15c == uVar16) {
                    pvVar14 = local_60;
                  }
                  iVar2 = (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start
                          [(long)piVar8[iVar13] * pDVar7->stride + (long)iVar1];
                  uVar12 = (ulong)iVar2;
                  if (uVar12 != 0xffffffffffffffff) {
                    iVar6 = iVar2 + 0x3f;
                    if (-1 < iVar2) {
                      iVar6 = iVar2;
                    }
                    uVar15 = (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001);
                    if ((*(ulong *)(local_130.stride + ((long)(iVar6 >> 6) + (uVar15 - 1)) * 8) >>
                         (uVar12 & 0x3f) & 1) == 0) {
                      lVar10 = local_138->num_dimensions * uVar12;
                      piVar8 = (local_138->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      local_70 = 1L << ((byte)iVar2 & 0x3f);
                      local_68 = (long)(iVar6 >> 6) * 8;
                      dVar18 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                                         (local_150->order,piVar8[lVar10],
                                          *local_c8.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start);
                      pGVar4 = local_150;
                      if (1 < (pGVar3->super_BaseCanonicalGrid).num_dimensions) {
                        lVar17 = 1;
                        do {
                          local_50 = dVar18;
                          dVar18 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                                             (pGVar4->order,piVar8[lVar10 + lVar17],
                                              local_c8.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start[lVar17]);
                          dVar18 = local_50 * dVar18;
                          lVar17 = lVar17 + 1;
                        } while (lVar17 < (pGVar4->super_BaseCanonicalGrid).num_dimensions);
                      }
                      local_80[uVar12] = local_80[uVar12] - dVar18 * local_80[local_148];
                      puVar11 = (ulong *)(local_130.stride + uVar15 * 8 + -8 + local_68);
                      *puVar11 = *puVar11 | local_70;
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar13 + 1] = 0;
                      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar13 + 1] = iVar2;
                      piVar5 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      piVar8 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      uVar9 = local_100;
                      iVar13 = iVar13 + 1;
                      goto LAB_00184b4f;
                    }
                  }
                  piVar5[iVar13] = iVar1 + 1;
                }
                else {
                  piVar5[(long)iVar13 + -1] = piVar5[(long)iVar13 + -1] + 1;
                  iVar13 = iVar13 + -1;
                }
LAB_00184b4f:
              } while (*piVar5 < (int)uVar9);
            }
          }
          uVar9 = local_148 + 1;
          local_108 = local_108 + 4;
        } while (uVar9 != local_78);
      }
      iVar13 = (int)local_140;
      local_140 = (ulong)(iVar13 - 1);
    } while (1 < iVar13);
  }
  if ((ulong *)local_130.stride != (ulong *)0x0) {
    operator_delete((void *)local_130.stride,
                    (long)local_130.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_130.stride);
    local_130.stride = 0;
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::getQuadratureWeights(double *weights) const{
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    integrateHierarchicalFunctions(weights);

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);

    double basis_value;

    Data2D<int> lparents;
    if (parents.getNumStrips() != work.getNumIndexes())
        lparents = HierarchyManipulations::computeDAGup<effrule>(work);

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    int num_points = work.getNumIndexes();
    std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(work);

    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);
    std::vector<bool> used(work.getNumIndexes(), false);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);
                            weights[branch] -= weights[i] * basis_value;
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}